

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemImpl.cpp
# Opt level: O1

string * efsw::Platform::findMountPoint(string *__return_storage_ptr__,string *file)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  string mp;
  string cwd;
  string dir;
  stat last_stat;
  stat file_stat;
  char *local_260;
  size_type local_258;
  char local_250;
  undefined7 uStack_24f;
  undefined8 uStack_248;
  char *local_240 [2];
  char local_230 [16];
  string local_220;
  char *local_200;
  char local_1f0 [16];
  stat local_1e0;
  stat local_150;
  stat local_c0;
  
  FileSystem::getCurrentWorkingDirectory_abi_cxx11_();
  stat((file->_M_dataplus)._M_p,&local_c0);
  local_258 = 0;
  local_250 = '\0';
  local_260 = &local_250;
  bVar2 = efsw::FileSystem::isDirectory(file);
  if (bVar2) {
    memcpy(&local_150,&local_c0,0x90);
    iVar3 = chdir((file->_M_dataplus)._M_p);
    if (iVar3 == -1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      goto LAB_0011fefc;
    }
LAB_0011fd70:
    do {
      iVar3 = stat("..",&local_1e0);
      iVar4 = 4;
      if (((-1 < iVar3) && (iVar4 = 3, local_1e0.st_dev == local_150.st_dev)) &&
         (local_1e0.st_ino != local_150.st_ino)) {
        local_240[0] = local_230;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"..","");
        iVar3 = chdir(local_240[0]);
        if (local_240[0] != local_230) {
          operator_delete(local_240[0]);
        }
        iVar4 = 4;
        if (iVar3 != -1) {
          memcpy(&local_150,&local_1e0,0x90);
          iVar4 = 0;
        }
      }
    } while (iVar4 == 0);
    if (iVar4 != 4) {
      if (iVar4 != 3) goto LAB_0011fefc;
      FileSystem::getCurrentWorkingDirectory_abi_cxx11_();
      std::__cxx11::string::operator=((string *)&local_260,(string *)&local_1e0);
      if ((__nlink_t *)local_1e0.st_dev != &local_1e0.st_nlink) {
        operator_delete((void *)local_1e0.st_dev);
      }
    }
    chdir(local_200);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_260 == &local_250) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_24f,local_250);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_248;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_260;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_24f,local_250);
    }
    __return_storage_ptr__->_M_string_length = local_258;
    local_258 = 0;
    local_250 = '\0';
    local_260 = &local_250;
  }
  else {
    pcVar1 = (file->_M_dataplus)._M_p;
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_220,pcVar1,pcVar1 + file->_M_string_length);
    efsw::FileSystem::pathRemoveFileName((string *)&local_1e0,&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p);
    }
    iVar3 = chdir((char *)local_1e0.st_dev);
    if (iVar3 == -1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    else {
      iVar3 = stat(".",&local_150);
      if (-1 < iVar3) {
        if ((__nlink_t *)local_1e0.st_dev != &local_1e0.st_nlink) {
          operator_delete((void *)local_1e0.st_dev);
        }
        goto LAB_0011fd70;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    if ((__nlink_t *)local_1e0.st_dev != &local_1e0.st_nlink) {
      operator_delete((void *)local_1e0.st_dev);
    }
  }
LAB_0011fefc:
  if (local_260 != &local_250) {
    operator_delete(local_260);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string findMountPoint( std::string file ) {
	std::string cwd = FileSystem::getCurrentWorkingDirectory();
	struct stat last_stat;
	struct stat file_stat;

	stat( file.c_str(), &file_stat );

	std::string mp;

	if ( efsw::FileSystem::isDirectory( file ) ) {
		last_stat = file_stat;

		if ( !FileSystem::changeWorkingDirectory( file ) )
			return "";
	} else {
		std::string dir = efsw::FileSystem::pathRemoveFileName( file );

		if ( !FileSystem::changeWorkingDirectory( dir ) )
			return "";

		if ( stat( ".", &last_stat ) < 0 )
			return "";
	}

	while ( true ) {
		struct stat st;

		if ( stat( "..", &st ) < 0 )
			goto done;

		if ( st.st_dev != last_stat.st_dev || st.st_ino == last_stat.st_ino )
			break;

		if ( !FileSystem::changeWorkingDirectory( ".." ) ) {
			goto done;
		}

		last_stat = st;
	}

	/* Finally reached a mount point, see what it's called.  */
	mp = FileSystem::getCurrentWorkingDirectory();

done:
	FileSystem::changeWorkingDirectory( cwd );

	return mp;
}